

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O0

void __thiscall
cpsm::testing::TestAssertionFailure::~TestAssertionFailure(TestAssertionFailure *this)

{
  TestAssertionFailure *in_RDI;
  
  ~TestAssertionFailure(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

TestAssertionFailure() : msg_("test assertion failed") {}